

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O3

void __thiscall opengv::absolute_pose::modules::Epnp::choose_control_points(Epnp *this)

{
  double (*padVar1) [3];
  double *pdVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double *pdVar13;
  Index index;
  long lVar14;
  ulong uVar15;
  long lVar16;
  double *pdVar17;
  ulong *puVar18;
  ActualDstType actualDst;
  int j;
  long lVar19;
  double *pdVar20;
  int j_1;
  ulong uVar21;
  double (*padVar22) [3];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  MatrixXd D;
  MatrixXd PW0;
  MatrixXd PW0tPW0;
  MatrixXd Ut;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD;
  DenseStorage<double,__1,__1,__1,_0> local_2b8;
  DenseStorage<double,__1,__1,__1,_0> local_298;
  MatrixType local_280;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *local_268;
  long local_260;
  long local_258;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> local_248;
  undefined1 extraout_var [56];
  
  this->cws[0][2] = 0.0;
  padVar1 = this->cws;
  this->cws[0][0] = 0.0;
  this->cws[0][1] = 0.0;
  iVar5 = this->number_of_correspondences;
  lVar16 = (long)iVar5;
  if (0 < lVar16) {
    pdVar13 = this->pws;
    lVar14 = 0;
    do {
      lVar19 = 0;
      do {
        (*padVar1)[lVar19] = pdVar13[lVar19] + (*padVar1)[lVar19];
        lVar19 = lVar19 + 1;
      } while (lVar19 != 3);
      lVar14 = lVar14 + 1;
      pdVar13 = pdVar13 + 3;
    } while (lVar14 != lVar16);
  }
  auVar27._0_8_ = (double)iVar5;
  auVar27._8_8_ = auVar27._0_8_;
  auVar27._16_8_ = auVar27._0_8_;
  auVar27._24_8_ = auVar27._0_8_;
  auVar23 = vdivpd_avx(*(undefined1 (*) [32])padVar1,auVar27);
  auVar23._24_8_ = this->cws[1][0];
  *(undefined1 (*) [32])padVar1 = auVar23;
  local_298.m_data = (double *)0x0;
  local_298.m_rows = 0;
  local_298.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_298,lVar16 * 3,lVar16,3);
  iVar5 = this->number_of_correspondences;
  if (0 < (long)iVar5) {
    pdVar13 = this->pws;
    lVar16 = 0;
    pdVar17 = local_298.m_data;
    do {
      lVar14 = 0;
      pdVar20 = pdVar17;
      do {
        pdVar2 = pdVar13 + lVar14;
        pdVar3 = *padVar1 + lVar14;
        lVar14 = lVar14 + 1;
        *pdVar20 = *pdVar2 - *pdVar3;
        pdVar20 = pdVar20 + local_298.m_rows;
      } while (lVar14 != 3);
      lVar16 = lVar16 + 1;
      pdVar13 = pdVar13 + 3;
      pdVar17 = pdVar17 + 1;
    } while (lVar16 != iVar5);
  }
  local_248.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.m_matrixU.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)&local_298;
  local_248.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.m_matrixU.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       (Index)&local_298;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_280,
             (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)&local_248);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (&local_248,&local_280,0x14);
  local_2b8.m_cols = 0;
  local_2b8.m_data = (double *)0x0;
  local_2b8.m_rows = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            (&local_2b8,
             local_248.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
             .m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows,
             local_248.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
             .m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows,1);
  if ((local_2b8.m_rows !=
       local_248.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
       m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_rows) || (lVar16 = 1, local_2b8.m_cols != 1)) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              (&local_2b8,
               local_248.
               super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
               m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows,
               local_248.
               super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
               m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows,1);
    local_248.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
    m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
         = local_2b8.m_rows;
    lVar16 = local_2b8.m_cols;
  }
  uVar21 = lVar16 * local_248.
                    super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                    m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows;
  uVar15 = uVar21 + 7;
  if (-1 < (long)uVar21) {
    uVar15 = uVar21;
  }
  uVar15 = uVar15 & 0xfffffffffffffff8;
  if (7 < (long)uVar21) {
    lVar16 = 0;
    do {
      pdVar13 = local_248.
                super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data + lVar16;
      dVar6 = pdVar13[1];
      dVar7 = pdVar13[2];
      dVar8 = pdVar13[3];
      dVar9 = pdVar13[4];
      dVar10 = pdVar13[5];
      dVar11 = pdVar13[6];
      dVar12 = pdVar13[7];
      pdVar17 = local_2b8.m_data + lVar16;
      *pdVar17 = *pdVar13;
      pdVar17[1] = dVar6;
      pdVar17[2] = dVar7;
      pdVar17[3] = dVar8;
      pdVar17[4] = dVar9;
      pdVar17[5] = dVar10;
      pdVar17[6] = dVar11;
      pdVar17[7] = dVar12;
      lVar16 = lVar16 + 8;
    } while (lVar16 < (long)uVar15);
  }
  if ((long)uVar15 < (long)uVar21) {
    do {
      local_2b8.m_data[uVar15] =
           local_248.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
           m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
           .m_data[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar21 - uVar15 != 0);
  }
  local_268 = &local_248;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_260,
             (DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_268);
  padVar22 = this->cws;
  lVar16 = 1;
  lVar14 = 0;
  do {
    padVar22 = padVar22 + 1;
    auVar24._0_8_ = local_2b8.m_data[lVar16 + -1] / (double)this->number_of_correspondences;
    auVar24._8_8_ = 0;
    if (auVar24._0_8_ < 0.0) {
      auVar25._0_8_ = sqrt(auVar24._0_8_);
      auVar25._8_56_ = extraout_var;
      auVar24 = auVar25._0_16_;
    }
    else {
      auVar24 = vsqrtsd_avx(auVar24,auVar24);
    }
    lVar19 = 0;
    puVar18 = (ulong *)(local_260 + lVar14);
    do {
      auVar26._8_8_ = 0;
      auVar26._0_8_ = *puVar18;
      puVar18 = puVar18 + local_258;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (*padVar1)[lVar19];
      auVar4 = vfmadd213sd_fma(auVar26,auVar24,auVar4);
      (*padVar22)[lVar19] = auVar4._0_8_;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    lVar16 = lVar16 + 1;
    lVar14 = lVar14 + 8;
  } while (lVar16 != 4);
  free(*(void **)(local_260 + -8));
  if (local_2b8.m_data != (double *)0x0) {
    free((void *)local_2b8.m_data[-1]);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&local_248);
  if (local_280.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_280.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data[-1]);
  }
  if (local_298.m_data != (double *)0x0) {
    free((void *)local_298.m_data[-1]);
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::choose_control_points(void)
{
  // Take C0 as the reference points centroid:
  cws[0][0] = cws[0][1] = cws[0][2] = 0;
  for(int i = 0; i < number_of_correspondences; i++)
    for(int j = 0; j < 3; j++)
      cws[0][j] += pws[3 * i + j];

  for(int j = 0; j < 3; j++)
    cws[0][j] /= number_of_correspondences;


  // Take C1, C2, and C3 from PCA on the reference points:
  Eigen::MatrixXd PW0(number_of_correspondences,3);

  for(int i = 0; i < number_of_correspondences; i++)
    for(int j = 0; j < 3; j++)
      PW0(i,j) = pws[3 * i + j] - cws[0][j];

  Eigen::MatrixXd PW0tPW0 = PW0.transpose() * PW0;
  Eigen::JacobiSVD< Eigen::MatrixXd > SVD(
      PW0tPW0,
      Eigen::ComputeFullV | Eigen::ComputeFullU );
  Eigen::MatrixXd D = SVD.singularValues();
  Eigen::MatrixXd Ut = SVD.matrixU().transpose();

  for(int i = 1; i < 4; i++)
  {
    double k = sqrt(D(i - 1,0) / number_of_correspondences);
    for(int j = 0; j < 3; j++)
      cws[i][j] = cws[0][j] + k * Ut((i - 1),j);
  }
}